

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetType.cpp
# Opt level: O1

void __thiscall
slang::ast::NetType::NetType(NetType *this,NetKind netKind,string_view name,Type *dataType)

{
  (this->super_Symbol).kind = NetType;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).location = (SourceLocation)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->super_Symbol).parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->super_Symbol).nextInScope + 4) = 0;
  DeclaredType::DeclaredType
            (&this->declaredType,&this->super_Symbol,(bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  this->netKind = netKind;
  (this->declaredType).type = dataType;
  (this->resolver).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>._M_payload
  .super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value =
       (SubroutineSymbol *)0x0;
  (this->resolver).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>._M_payload
  .super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged = true;
  return;
}

Assistant:

NetType::NetType(NetKind netKind, std::string_view name, const Type& dataType) :
    Symbol(SymbolKind::NetType, name, SourceLocation()), declaredType(*this), netKind(netKind) {
    declaredType.setType(dataType);
    resolver = nullptr;
}